

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O0

void __thiscall
SparseHashMapMoveTest_Emplace_Test::~SparseHashMapMoveTest_Emplace_Test
          (SparseHashMapMoveTest_Emplace_Test *this)

{
  void *in_RDI;
  
  ~SparseHashMapMoveTest_Emplace_Test((SparseHashMapMoveTest_Emplace_Test *)0x1096008);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(SparseHashMapMoveTest, Emplace)
{
    sparse_hash_map<int, int> h;

    auto p = h.emplace(5, 1234);
    ASSERT_EQ(true, p.second);
    ASSERT_EQ(5, p.first->first);
    ASSERT_EQ(1234, p.first->second);

    p = h.emplace(10, 5678);
    ASSERT_EQ(true, p.second);
    ASSERT_EQ(10, p.first->first);
    ASSERT_EQ(5678, p.first->second);

    ASSERT_EQ(2, (int)h.size());

    ASSERT_TRUE(h.emplace(11, 1).second);
    ASSERT_FALSE(h.emplace(11, 1).second);
    ASSERT_TRUE(h.emplace(12, 1).second);
    ASSERT_FALSE(h.emplace(12, 1).second);
}